

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

char * proxy_description(Interactor *itr)

{
  undefined8 uVar1;
  uint uVar2;
  char *pcVar3;
  ProxySocket *ps;
  Interactor *itr_local;
  
  if (itr[-4].vt != (InteractorVtable *)0x0) {
    uVar1 = *(undefined8 *)((itr[-4].vt)->description + 0x18);
    pcVar3 = conf_get_str((Conf *)itr[-2].vt,0xe);
    uVar2 = conf_get_int((Conf *)itr[-2].vt,0xf);
    pcVar3 = dupprintf("%s connection to %s port %d",uVar1,pcVar3,(ulong)uVar2);
    return pcVar3;
  }
  __assert_fail("ps->pn",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/proxy.c",
                0x1b8,"char *proxy_description(Interactor *)");
}

Assistant:

static char *proxy_description(Interactor *itr)
{
    ProxySocket *ps = container_of(itr, ProxySocket, interactor);
    assert(ps->pn);
    return dupprintf("%s connection to %s port %d", ps->pn->vt->type,
                     conf_get_str(ps->conf, CONF_proxy_host),
                     conf_get_int(ps->conf, CONF_proxy_port));
}